

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_add_mutex_group
              (cargo_t ctx,cargo_mutex_group_flags_t flags,char *name,char *title,char *description,
              ...)

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  char *pcStack_38;
  int ret;
  char *d;
  char *description_local;
  char *title_local;
  char *name_local;
  cargo_t pcStack_10;
  cargo_mutex_group_flags_t flags_local;
  cargo_t ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  pcStack_38 = (char *)0x0;
  ap[0].reg_save_area._4_4_ = 0;
  local_e0 = in_R9;
  d = description;
  description_local = title;
  title_local = name;
  name_local._4_4_ = flags;
  pcStack_10 = ctx;
  if (ctx != (cargo_t)0x0) {
    if (description != (char *)0x0) {
      ap[0].overflow_arg_area = local_108;
      ap[0]._0_8_ = &stack0x00000008;
      local_58._4_4_ = 0x30;
      local_58._0_4_ = 0x28;
      cargo_vasprintf(&stack0xffffffffffffffc8,description,(__va_list_tag *)local_58);
    }
    ap[0].reg_save_area._4_4_ =
         _cargo_add_group(pcStack_10,&pcStack_10->mutex_groups,&pcStack_10->mutex_group_count,
                          &pcStack_10->mutex_max_groups,(ulong)name_local._4_4_,title_local,
                          description_local,pcStack_38);
    _cargo_xfree(&stack0xffffffffffffffc8);
    return ap[0].reg_save_area._4_4_;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1705,
                "int cargo_add_mutex_group(cargo_t, cargo_mutex_group_flags_t, const char *, const char *, const char *, ...)"
               );
}

Assistant:

int cargo_add_mutex_group(cargo_t ctx,
                        cargo_mutex_group_flags_t flags,
                        const char *name,
                        const char *title,
                        const char *description, ...)
{
    char *d = NULL;
    int ret = 0;
    va_list ap;
    assert(ctx);

    if (description)
    {
        va_start(ap, description);
        cargo_vasprintf(&d, description, ap);
        va_end(ap);
    }

    ret = _cargo_add_group(ctx, &ctx->mutex_groups, &ctx->mutex_group_count,
                            &ctx->mutex_max_groups,
                            (size_t)flags, name, title, d);
    _cargo_xfree(&d);
    return ret;
}